

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

uint64_t __thiscall
capnp::compiler::NodeTranslator::
compileParamList<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__1>
          (NodeTranslator *this,StringPtr methodName,uint16_t ordinal,bool isResults,
          Reader paramList,Reader implicitParams,Type *initBrand)

{
  Resolver *pRVar1;
  ErrorReporter *pEVar2;
  Reader params;
  Reader source;
  ImplicitParams implicitMethodParams;
  Reader name;
  Builder builder_00;
  Builder sourceInfo;
  undefined1 auVar3 [56];
  Reader RVar4;
  undefined8 uVar5;
  bool bVar6;
  Which WVar7;
  uint uVar8;
  uint32_t uVar9;
  size_t sVar10;
  size_t sVar11;
  Orphan<capnp::schema::Node> *pOVar12;
  Orphan<capnp::schema::Node::SourceInfo> *pOVar13;
  BrandScope *pBVar14;
  unsigned_long *puVar15;
  NullableValue<capnp::compiler::BrandedDecl> *other;
  BrandedDecl *pBVar16;
  NullableValue<capnp::compiler::Declaration::Which> *other_00;
  Which *pWVar17;
  Type *initBrand_00;
  NullableValue<capnp::compiler::Resolver::ResolvedDecl> *other_01;
  ResolvedDecl *pRVar18;
  uint64_t uVar19;
  NodeTranslator *params_2;
  Range<unsigned_long> RVar20;
  ArrayPtr<const_char> value;
  undefined8 uVar21;
  bool local_a02;
  ArrayPtr<const_char> local_9a0;
  ArrayPtr<const_char> local_990;
  StringPtr local_978;
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_968;
  ResolvedDecl *local_8f8;
  ResolvedDecl *streamCapnp;
  size_t local_8e8;
  Maybe<capnp::compiler::Resolver::ResolvedDecl> local_8e0;
  undefined1 local_878 [8];
  NullableValue<capnp::compiler::Resolver::ResolvedDecl> _streamCapnp1725;
  Reader local_800;
  String local_7d0;
  String local_7b8;
  ArrayPtr<const_char> local_7a0;
  Reader local_790;
  int local_75c;
  Which *local_758;
  Which *kind;
  undefined1 auStack_748 [4];
  NullableValue<capnp::compiler::Declaration::Which> _kind1707;
  BrandedDecl *target;
  undefined1 local_708 [40];
  BrandScope *pBStack_6e0;
  Maybe<capnp::compiler::BrandedDecl> local_6d8;
  undefined1 local_628 [8];
  NullableValue<capnp::compiler::BrandedDecl> _target1706;
  Array<capnp::compiler::BrandedDecl> local_548;
  undefined1 local_530 [24];
  Disposer *local_518;
  Builder local_510;
  BrandedDecl local_4e8;
  undefined1 local_440 [8];
  Reader param;
  unsigned_long i;
  Iterator __end5;
  Iterator __begin5;
  Range<unsigned_long> *__range5;
  Builder implicitBuilder;
  ArrayBuilder<capnp::compiler::BrandedDecl> implicitDecls;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> brand;
  Orphan<capnp::schema::Node::SourceInfo> local_368;
  uint64_t local_348;
  uint64_t id;
  CapTableBuilder *pCStack_338;
  void *local_330;
  WirePointer *pWStack_328;
  StructDataBitCount local_320;
  StructPointerCount SStack_31c;
  undefined2 uStack_31a;
  int local_318;
  undefined4 uStack_314;
  SegmentBuilder *pSStack_310;
  CapTableBuilder *local_308;
  void *pvStack_300;
  WirePointer *local_2f8;
  Reader local_2f0;
  SegmentReader *pSStack_2b8;
  CapTableReader *pCStack_2b0;
  byte *pbStack_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  StructTranslator local_288;
  undefined1 local_1a8 [8];
  BuilderFor<capnp::schema::Node::SourceInfo> sourceInfoBuilder;
  Builder local_158;
  undefined1 local_139;
  ArrayPtr<const_char> local_138;
  String local_128;
  ArrayPtr<const_char> local_110;
  undefined1 local_100 [16];
  String typeName;
  ReaderFor<capnp::schema::Node> parent;
  BuilderFor<capnp::schema::Node> builder;
  undefined1 local_78 [8];
  Orphan<capnp::schema::Node::SourceInfo> newSourceInfo;
  Orphan<capnp::schema::Node> newStruct;
  Type *initBrand_local;
  bool isResults_local;
  uint16_t ordinal_local;
  NodeTranslator *this_local;
  StringPtr methodName_local;
  
  methodName_local.content.ptr = (char *)methodName.content.size_;
  params_2 = (NodeTranslator *)methodName.content.ptr;
  this_local = params_2;
  WVar7 = Declaration::ParamList::Reader::which(&paramList);
  if (WVar7 == NAMED_LIST) {
    Orphanage::newOrphan<capnp::schema::Node>
              ((Orphan<capnp::schema::Node> *)&newSourceInfo.builder.location,&this->orphanage);
    Orphanage::newOrphan<capnp::schema::Node::SourceInfo>
              ((Orphan<capnp::schema::Node::SourceInfo> *)local_78,&this->orphanage);
    Orphan<capnp::schema::Node>::get
              ((BuilderFor<capnp::schema::Node> *)&parent._reader.nestingLimit,
               (Orphan<capnp::schema::Node> *)&newSourceInfo.builder.location);
    Orphan<capnp::schema::Node>::getReader
              ((ReaderFor<capnp::schema::Node> *)&typeName.content.disposer,&this->wipNode);
    local_100._0_8_ = "$Params";
    if (isResults) {
      local_100._0_8_ = "$Results";
    }
    kj::str<kj::StringPtr&,char_const*>
              ((String *)(local_100 + 8),(kj *)&this_local,(StringPtr *)local_100,
               (char **)"$Results");
    uVar19 = capnp::schema::Node::Reader::getId((Reader *)&typeName.content.disposer);
    uVar19 = generateMethodParamsId(uVar19,ordinal,isResults);
    capnp::schema::Node::Builder::setId((Builder *)&parent._reader.nestingLimit,uVar19);
    local_138 = (ArrayPtr<const_char>)
                capnp::schema::Node::Reader::getDisplayName((Reader *)&typeName.content.disposer);
    local_139 = 0x2e;
    kj::str<capnp::Text::Reader,char,kj::String&>
              (&local_128,(kj *)&local_138,(Reader *)&local_139,local_100 + 8,(String *)params_2);
    Text::Reader::Reader((Reader *)&local_110,&local_128);
    capnp::schema::Node::Builder::setDisplayName
              ((Builder *)&parent._reader.nestingLimit,(Reader)local_110);
    kj::String::~String(&local_128);
    capnp::schema::Node::Builder::getDisplayName(&local_158,(Builder *)&parent._reader.nestingLimit)
    ;
    sVar10 = Text::Builder::size(&local_158);
    sVar11 = kj::String::size((String *)(local_100 + 8));
    capnp::schema::Node::Builder::setDisplayNamePrefixLength
              ((Builder *)&parent._reader.nestingLimit,(int)sVar10 - (int)sVar11);
    bVar6 = capnp::schema::Node::Reader::getIsGeneric((Reader *)&typeName.content.disposer);
    local_a02 = true;
    if (!bVar6) {
      uVar8 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                        (&implicitParams);
      local_a02 = uVar8 != 0;
    }
    capnp::schema::Node::Builder::setIsGeneric((Builder *)&parent._reader.nestingLimit,local_a02);
    capnp::schema::Node::Builder::setScopeId((Builder *)&parent._reader.nestingLimit,0);
    uVar9 = Declaration::ParamList::Reader::getStartByte(&paramList);
    capnp::schema::Node::Builder::setStartByte((Builder *)&parent._reader.nestingLimit,uVar9);
    uVar9 = Declaration::ParamList::Reader::getEndByte(&paramList);
    capnp::schema::Node::Builder::setEndByte((Builder *)&parent._reader.nestingLimit,uVar9);
    capnp::schema::Node::Builder::initStruct
              ((Builder *)&sourceInfoBuilder._builder.dataSize,
               (Builder *)&parent._reader.nestingLimit);
    Orphan<capnp::schema::Node::SourceInfo>::get
              ((BuilderFor<capnp::schema::Node::SourceInfo> *)local_1a8,
               (Orphan<capnp::schema::Node::SourceInfo> *)local_78);
    uVar19 = capnp::schema::Node::Builder::getId((Builder *)&parent._reader.nestingLimit);
    capnp::schema::Node::SourceInfo::Builder::setId((Builder *)local_1a8,uVar19);
    uVar9 = Declaration::ParamList::Reader::getStartByte(&paramList);
    capnp::schema::Node::SourceInfo::Builder::setStartByte((Builder *)local_1a8,uVar9);
    uVar9 = Declaration::ParamList::Reader::getEndByte(&paramList);
    capnp::schema::Node::SourceInfo::Builder::setEndByte((Builder *)local_1a8,uVar9);
    uVar19 = capnp::schema::Node::Builder::getId((Builder *)&parent._reader.nestingLimit);
    RVar4 = implicitParams;
    pSStack_2b8 = implicitParams.reader.segment;
    pCStack_2b0 = implicitParams.reader.capTable;
    pbStack_2a8 = implicitParams.reader.ptr;
    uStack_2a0._0_4_ = implicitParams.reader.elementCount;
    uStack_2a0._4_4_ = implicitParams.reader.step;
    implicitParams.reader._32_8_ = RVar4.reader._32_8_;
    local_298._0_4_ = implicitParams.reader.structDataSize;
    local_298._4_2_ = implicitParams.reader.structPointerCount;
    local_298._6_1_ = implicitParams.reader.elementSize;
    local_298._7_1_ = implicitParams.reader._39_1_;
    implicitParams.reader._40_8_ = RVar4.reader._40_8_;
    uStack_290._0_4_ = implicitParams.reader.nestingLimit;
    uStack_290._4_4_ = implicitParams.reader._44_4_;
    implicitMethodParams.params.reader.segment = implicitParams.reader.segment;
    implicitMethodParams.scopeId = uVar19;
    implicitMethodParams.params.reader.capTable = implicitParams.reader.capTable;
    implicitMethodParams.params.reader.ptr = implicitParams.reader.ptr;
    implicitMethodParams.params.reader.elementCount = implicitParams.reader.elementCount;
    implicitMethodParams.params.reader.step = implicitParams.reader.step;
    implicitMethodParams.params.reader.structDataSize = implicitParams.reader.structDataSize;
    implicitMethodParams.params.reader.structPointerCount = implicitParams.reader.structPointerCount
    ;
    implicitMethodParams.params.reader.elementSize = implicitParams.reader.elementSize;
    implicitMethodParams.params.reader._39_1_ = implicitParams.reader._39_1_;
    implicitMethodParams.params.reader.nestingLimit = implicitParams.reader.nestingLimit;
    implicitMethodParams.params.reader._44_4_ = implicitParams.reader._44_4_;
    implicitParams = RVar4;
    StructTranslator::StructTranslator(&local_288,this,implicitMethodParams);
    Declaration::ParamList::Reader::getNamedList(&local_2f0,&paramList);
    local_2f8 = builder._builder.pointers;
    local_308 = builder._builder.capTable;
    pvStack_300 = builder._builder.data;
    local_318 = parent._reader.nestingLimit;
    uStack_314 = parent._reader._44_4_;
    pSStack_310 = builder._builder.segment;
    Orphan<capnp::schema::Node::SourceInfo>::get
              ((BuilderFor<capnp::schema::Node::SourceInfo> *)&id,
               (Orphan<capnp::schema::Node::SourceInfo> *)local_78);
    params.reader.capTable = local_2f0.reader.capTable;
    params.reader.segment = local_2f0.reader.segment;
    params.reader.ptr = local_2f0.reader.ptr;
    params.reader.elementCount = local_2f0.reader.elementCount;
    params.reader.step = local_2f0.reader.step;
    params.reader.structDataSize = local_2f0.reader.structDataSize;
    params.reader.structPointerCount = local_2f0.reader.structPointerCount;
    params.reader.elementSize = local_2f0.reader.elementSize;
    params.reader._39_1_ = local_2f0.reader._39_1_;
    params.reader.nestingLimit = local_2f0.reader.nestingLimit;
    params.reader._44_4_ = local_2f0.reader._44_4_;
    builder_00._builder.capTable = (CapTableBuilder *)pSStack_310;
    builder_00._builder.segment = (SegmentBuilder *)_local_318;
    builder_00._builder.data = local_308;
    builder_00._builder.pointers = (WirePointer *)pvStack_300;
    builder_00._builder._32_8_ = local_2f8;
    sourceInfo._builder.capTable = pCStack_338;
    sourceInfo._builder.segment = (SegmentBuilder *)id;
    sourceInfo._builder.data = local_330;
    sourceInfo._builder.pointers = pWStack_328;
    sourceInfo._builder.dataSize = local_320;
    sourceInfo._builder.pointerCount = SStack_31c;
    sourceInfo._builder._38_2_ = uStack_31a;
    StructTranslator::translate(&local_288,params,builder_00,sourceInfo);
    StructTranslator::~StructTranslator(&local_288);
    local_348 = capnp::schema::Node::Builder::getId((Builder *)&parent._reader.nestingLimit);
    pOVar12 = kj::mv<capnp::Orphan<capnp::schema::Node>>
                        ((Orphan<capnp::schema::Node> *)&newSourceInfo.builder.location);
    Orphan<capnp::schema::Node>::Orphan((Orphan<capnp::schema::Node> *)&brand.ptr,pOVar12);
    pOVar13 = kj::mv<capnp::Orphan<capnp::schema::Node::SourceInfo>>
                        ((Orphan<capnp::schema::Node::SourceInfo> *)local_78);
    Orphan<capnp::schema::Node::SourceInfo>::Orphan(&local_368,pOVar13);
    kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::
    add<capnp::compiler::NodeTranslator::AuxNode>(&this->paramStructs,(AuxNode *)&brand.ptr);
    AuxNode::~AuxNode((AuxNode *)&brand.ptr);
    pBVar14 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->(&this->localBrand);
    uVar19 = capnp::schema::Node::Builder::getId((Builder *)&parent._reader.nestingLimit);
    List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
              (&implicitParams);
    BrandScope::push((BrandScope *)&implicitDecls.disposer,(uint64_t)pBVar14,(uint)uVar19);
    uVar8 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                      (&implicitParams);
    if (uVar8 != 0) {
      uVar8 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                        (&implicitParams);
      kj::heapArrayBuilder<capnp::compiler::BrandedDecl>
                ((ArrayBuilder<capnp::compiler::BrandedDecl> *)
                 &implicitBuilder.builder.structDataSize,(ulong)uVar8);
      uVar8 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                        (&implicitParams);
      capnp::schema::Node::Builder::initParameters
                ((Builder *)&__range5,(Builder *)&parent._reader.nestingLimit,uVar8);
      RVar20 = kj::
               indices<capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                         (&implicitParams);
      __begin5.value = RVar20.begin_;
      __end5 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin5);
      i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin5);
      while( true ) {
        bVar6 = kj::Range<unsigned_long>::Iterator::operator==(&__end5,(Iterator *)&i);
        if (((bVar6 ^ 0xffU) & 1) == 0) break;
        puVar15 = kj::Range<unsigned_long>::Iterator::operator*(&__end5);
        param._reader._40_8_ = *puVar15;
        List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)local_440,&implicitParams,param._reader.nestingLimit);
        BrandedDecl::implicitMethodParam(&local_4e8,param._reader.nestingLimit);
        kj::ArrayBuilder<capnp::compiler::BrandedDecl>::add<capnp::compiler::BrandedDecl>
                  ((ArrayBuilder<capnp::compiler::BrandedDecl> *)
                   &implicitBuilder.builder.structDataSize,&local_4e8);
        BrandedDecl::~BrandedDecl(&local_4e8);
        List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Builder::operator[]
                  (&local_510,(Builder *)&__range5,param._reader.nestingLimit);
        value = (ArrayPtr<const_char>)
                Declaration::BrandParameter::Reader::getName((Reader *)local_440);
        unique0x1000258a = value;
        capnp::schema::Node::Parameter::Builder::setName(&local_510,(Reader)value);
        kj::Range<unsigned_long>::Iterator::operator++(&__end5);
      }
      pBVar14 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->
                          ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)
                           &implicitDecls.disposer);
      kj::ArrayBuilder<capnp::compiler::BrandedDecl>::finish
                (&local_548,
                 (ArrayBuilder<capnp::compiler::BrandedDecl> *)
                 &implicitBuilder.builder.structDataSize);
      _target1706.field_1._160_8_ = 0;
      Expression::Reader::Reader((Reader *)&_target1706.field_1.value.source._reader.nestingLimit);
      BrandScope::setParams
                ((BrandScope *)local_530,(Array<capnp::compiler::BrandedDecl> *)pBVar14,
                 (Which)&local_548,(Reader)ZEXT848((ulong)_target1706.field_1._160_8_));
      kj::Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_>::~Maybe
                ((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)local_530);
      kj::Array<capnp::compiler::BrandedDecl>::~Array(&local_548);
      kj::ArrayBuilder<capnp::compiler::BrandedDecl>::~ArrayBuilder
                ((ArrayBuilder<capnp::compiler::BrandedDecl> *)
                 &implicitBuilder.builder.structDataSize);
    }
    pBVar14 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->
                        ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&implicitDecls.disposer
                        );
    BrandScope::
    compile<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__1&>
              (pBVar14,initBrand);
    methodName_local.content.size_ = local_348;
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own
              ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&implicitDecls.disposer);
    kj::String::~String((String *)(local_100 + 8));
    Orphan<capnp::schema::Node::SourceInfo>::~Orphan
              ((Orphan<capnp::schema::Node::SourceInfo> *)local_78);
    Orphan<capnp::schema::Node>::~Orphan
              ((Orphan<capnp::schema::Node> *)&newSourceInfo.builder.location);
    return methodName_local.content.size_;
  }
  if (WVar7 != TYPE) {
    if (WVar7 == STREAM) {
      pRVar1 = this->resolver;
      kj::StringPtr::StringPtr((StringPtr *)&streamCapnp,"/capnp/stream.capnp");
      (*pRVar1->_vptr_Resolver[8])(&local_8e0,pRVar1,streamCapnp,local_8e8);
      other_01 = kj::_::readMaybe<capnp::compiler::Resolver::ResolvedDecl>(&local_8e0);
      kj::_::NullableValue<capnp::compiler::Resolver::ResolvedDecl>::NullableValue
                ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)local_878,other_01);
      kj::Maybe<capnp::compiler::Resolver::ResolvedDecl>::~Maybe(&local_8e0);
      pRVar18 = kj::_::NullableValue::operator_cast_to_ResolvedDecl_((NullableValue *)local_878);
      if (pRVar18 == (ResolvedDecl *)0x0) {
        pEVar2 = this->errorReporter;
        kj::StringPtr::StringPtr
                  ((StringPtr *)&local_9a0,
                   "A method declaration uses streaming, but \'/capnp/stream.capnp\' is not found in the import path. This is a standard file that should always be installed with the Cap\'n Proto compiler."
                  );
        ErrorReporter::addErrorOn<capnp::compiler::Declaration::ParamList::Reader&>
                  (pEVar2,&paramList,(StringPtr)local_9a0);
      }
      else {
        local_8f8 = kj::_::NullableValue<capnp::compiler::Resolver::ResolvedDecl>::operator*
                              ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)local_878);
        pRVar1 = local_8f8->resolver;
        kj::StringPtr::StringPtr(&local_978,"StreamResult");
        (*pRVar1->_vptr_Resolver[1])
                  (&local_968,pRVar1,local_978.content.ptr,local_978.content.size_);
        bVar6 = kj::
                Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
                ::operator==(&local_968);
        kj::
        Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
        ::~Maybe(&local_968);
        if (bVar6) {
          pEVar2 = this->errorReporter;
          kj::StringPtr::StringPtr
                    ((StringPtr *)&local_990,
                     "The version of \'/capnp/stream.capnp\' found in your import path does not appear to be the official one; it is missing the declaration of StreamResult."
                    );
          ErrorReporter::addErrorOn<capnp::compiler::Declaration::ParamList::Reader&>
                    (pEVar2,&paramList,(StringPtr)local_990);
        }
      }
      kj::_::NullableValue<capnp::compiler::Resolver::ResolvedDecl>::~NullableValue
                ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)local_878);
      uVar19 = typeId<capnp::StreamResult,capnp::StreamResult::_capnpPrivate>();
      return uVar19;
    }
    kj::_::unreachable();
  }
  Declaration::ParamList::Reader::getType((Reader *)local_708,&paramList);
  uVar21 = 0;
  source._reader.capTable = (CapTableReader *)local_708._8_8_;
  source._reader.segment = (SegmentReader *)local_708._0_8_;
  source._reader.data = (void *)local_708._16_8_;
  source._reader.pointers = (WirePointer *)local_708._24_8_;
  source._reader.dataSize = local_708._32_4_;
  source._reader.pointerCount = local_708._36_2_;
  source._reader._38_2_ = local_708._38_2_;
  source._reader._40_8_ = pBStack_6e0;
  auVar3._48_8_ = 0;
  auVar3._0_8_ = implicitParams.reader.segment;
  auVar3._8_8_ = implicitParams.reader.capTable;
  auVar3._16_8_ = implicitParams.reader.ptr;
  auVar3._24_4_ = implicitParams.reader.elementCount;
  auVar3._28_4_ = implicitParams.reader.step;
  auVar3._32_4_ = implicitParams.reader.structDataSize;
  auVar3._36_2_ = implicitParams.reader.structPointerCount;
  auVar3[0x26] = implicitParams.reader.elementSize;
  auVar3[0x27] = implicitParams.reader._39_1_;
  auVar3._40_4_ = implicitParams.reader.nestingLimit;
  auVar3._44_4_ = implicitParams.reader._44_4_;
  compileDeclExpression(&local_6d8,this,source,(ImplicitParams)(auVar3 << 0x40));
  other = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_6d8);
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_628,other);
  kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_6d8);
  pBVar16 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_628);
  if (pBVar16 != (BrandedDecl *)0x0) {
    _auStack_748 = kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                             ((NullableValue<capnp::compiler::BrandedDecl> *)local_628);
    BrandedDecl::getKind((BrandedDecl *)&kind);
    other_00 = kj::_::readMaybe<capnp::compiler::Declaration::Which>
                         ((Maybe<capnp::compiler::Declaration::Which> *)&kind);
    kj::_::NullableValue<capnp::compiler::Declaration::Which>::NullableValue
              ((NullableValue<capnp::compiler::Declaration::Which> *)((long)&kind + 4),other_00);
    kj::Maybe<capnp::compiler::Declaration::Which>::~Maybe
              ((Maybe<capnp::compiler::Declaration::Which> *)&kind);
    pWVar17 = kj::_::NullableValue::operator_cast_to_Which_((NullableValue *)((long)&kind + 4));
    uVar5 = _auStack_748;
    if (pWVar17 == (Which *)0x0) {
      pEVar2 = this->errorReporter;
      kj::StringPtr::StringPtr
                ((StringPtr *)
                 &_streamCapnp1725.field_1.value.brand.ptr.field_1.value._reader.nestingLimit,
                 "Cannot use generic parameter as whole input or output of a method. Instead, use a parameter/result list containing a field with this type."
                );
      BrandedDecl::addError((BrandedDecl *)uVar5,pEVar2,(StringPtr)stack0xfffffffffffff7f0);
      methodName_local.content.size_ = 0;
      local_75c = 1;
    }
    else {
      local_758 = kj::_::NullableValue<capnp::compiler::Declaration::Which>::operator*
                            ((NullableValue<capnp::compiler::Declaration::Which> *)((long)&kind + 4)
                            );
      uVar5 = _auStack_748;
      if (*local_758 == STRUCT) {
        initBrand_00 = kj::
                       fwd<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__1>
                                 (initBrand);
        methodName_local.content.size_ =
             BrandedDecl::
             getIdAndFillBrand<capnp::compiler::NodeTranslator::compileInterface(capnp::compiler::Declaration::Interface::Reader,capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>::Reader,capnp::schema::Node::Builder)::__1>
                       ((BrandedDecl *)uVar5,initBrand_00);
        local_75c = 1;
      }
      else {
        pEVar2 = this->errorReporter;
        Declaration::ParamList::Reader::getType(&local_790,&paramList);
        Declaration::ParamList::Reader::getType(&local_800,&paramList);
        name._reader.capTable = (CapTableReader *)local_800._reader.data;
        name._reader.segment = (SegmentReader *)local_800._reader.capTable;
        name._reader.data = local_800._reader.pointers;
        name._reader.pointers = (WirePointer *)local_800._reader._32_8_;
        name._reader.dataSize = local_800._reader.nestingLimit;
        name._reader.pointerCount = local_800._reader._44_2_;
        name._reader._38_2_ = local_800._reader._46_2_;
        name._reader._40_8_ = uVar21;
        expressionString(name);
        kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                  (&local_7b8,(kj *)0x2d7cf1,(char (*) [2])&local_7d0,
                   (String *)"\' is not a struct type.",(char (*) [24])params_2);
        kj::StringPtr::StringPtr((StringPtr *)&local_7a0,&local_7b8);
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader>
                  (pEVar2,&local_790,(StringPtr)local_7a0);
        kj::String::~String(&local_7b8);
        kj::String::~String(&local_7d0);
        local_75c = 0;
      }
    }
    kj::_::NullableValue<capnp::compiler::Declaration::Which>::~NullableValue
              ((NullableValue<capnp::compiler::Declaration::Which> *)((long)&kind + 4));
    if (local_75c != 0) goto LAB_00165edd;
  }
  local_75c = 0;
LAB_00165edd:
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_628);
  if (local_75c == 0) {
    methodName_local.content.size_ = 0;
  }
  return methodName_local.content.size_;
}

Assistant:

uint64_t NodeTranslator::compileParamList(
    kj::StringPtr methodName, uint16_t ordinal, bool isResults,
    Declaration::ParamList::Reader paramList,
    typename List<Declaration::BrandParameter>::Reader implicitParams,
    InitBrandFunc&& initBrand) {
  switch (paramList.which()) {
    case Declaration::ParamList::NAMED_LIST: {
      auto newStruct = orphanage.newOrphan<schema::Node>();
      auto newSourceInfo = orphanage.newOrphan<schema::Node::SourceInfo>();
      auto builder = newStruct.get();
      auto parent = wipNode.getReader();

      kj::String typeName = kj::str(methodName, isResults ? "$Results" : "$Params");

      builder.setId(generateMethodParamsId(parent.getId(), ordinal, isResults));
      builder.setDisplayName(kj::str(parent.getDisplayName(), '.', typeName));
      builder.setDisplayNamePrefixLength(builder.getDisplayName().size() - typeName.size());
      builder.setIsGeneric(parent.getIsGeneric() || implicitParams.size() > 0);
      builder.setScopeId(0);  // detached struct type
      builder.setStartByte(paramList.getStartByte());
      builder.setEndByte(paramList.getEndByte());

      builder.initStruct();

      // Put `sourceInfoBuilder` is a smaller scope since we move `newSourceInfo` later.
      {
        auto sourceInfoBuilder = newSourceInfo.get();

        sourceInfoBuilder.setId(builder.getId());
        sourceInfoBuilder.setStartByte(paramList.getStartByte());
        sourceInfoBuilder.setEndByte(paramList.getEndByte());
      }

      // Note that the struct we create here has a brand parameter list mirrioring the method's
      // implicit parameter list. Of course, fields inside the struct using the method's implicit
      // params as types actually need to refer to them as regular params, so we create an
      // ImplicitParams with a scopeId here.
      StructTranslator(*this, ImplicitParams { builder.getId(), implicitParams })
          .translate(paramList.getNamedList(), builder, newSourceInfo.get());
      uint64_t id = builder.getId();
      paramStructs.add(AuxNode { kj::mv(newStruct), kj::mv(newSourceInfo) });

      auto brand = localBrand->push(builder.getId(), implicitParams.size());

      if (implicitParams.size() > 0) {
        auto implicitDecls = kj::heapArrayBuilder<BrandedDecl>(implicitParams.size());
        auto implicitBuilder = builder.initParameters(implicitParams.size());

        for (auto i: kj::indices(implicitParams)) {
          auto param = implicitParams[i];
          implicitDecls.add(BrandedDecl::implicitMethodParam(i));
          implicitBuilder[i].setName(param.getName());
        }

        brand->setParams(implicitDecls.finish(), Declaration::STRUCT, Expression::Reader());
      }

      brand->compile(initBrand);
      return id;
    }
    case Declaration::ParamList::TYPE:
      KJ_IF_SOME(target, compileDeclExpression(
          paramList.getType(), ImplicitParams { 0, implicitParams })) {
        KJ_IF_SOME(kind, target.getKind()) {
          if (kind == Declaration::STRUCT) {
            return target.getIdAndFillBrand(kj::fwd<InitBrandFunc>(initBrand));
          } else {
            errorReporter.addErrorOn(
                paramList.getType(),
                kj::str("'", expressionString(paramList.getType()), "' is not a struct type."));
          }
        } else {
          // A variable?
          target.addError(errorReporter,
              "Cannot use generic parameter as whole input or output of a method. Instead, "
              "use a parameter/result list containing a field with this type.");
          return 0;
        }
      }
      return 0;
    case Declaration::ParamList::STREAM:
      KJ_IF_SOME(streamCapnp, resolver.resolveImport("/capnp/stream.capnp")) {
        if (streamCapnp.resolver->resolveMember("StreamResult") == kj::none) {
          errorReporter.addErrorOn(paramList,
              "The version of '/capnp/stream.capnp' found in your import path does not appear "
              "to be the official one; it is missing the declaration of StreamResult.");
        }
      } else {
        errorReporter.addErrorOn(paramList,
            "A method declaration uses streaming, but '/capnp/stream.capnp' is not found "
            "in the import path. This is a standard file that should always be installed "
            "with the Cap'n Proto compiler.");
      }